

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::EnhancedLayouts::FragmentDataLocationAPITest::getPassSnippet_abi_cxx11_
          (string *__return_storage_ptr__,FragmentDataLocationAPITest *this,GLuint param_1,
          VaryingPassthrough *param_2,STAGES stage)

{
  STAGES stage_local;
  VaryingPassthrough *param_2_local;
  GLuint param_1_local;
  FragmentDataLocationAPITest *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (stage == FRAGMENT) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "chichi = vec4(0, 0, 1, 1);\n    goku   = vec4(0, 0, 0, 1);\n    goten  = vec4(0, 1, 0, 1);\n    gohan  = vec4(1, 0, 0, 1);\n"
              );
  }
  else {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FragmentDataLocationAPITest::getPassSnippet(GLuint /* test_case_index */,
														Utils::VaryingPassthrough& /* varying_passthrough */,
														Utils::Shader::STAGES stage)
{
	std::string result;

	/* Skip for compute shader */
	if (Utils::Shader::FRAGMENT != stage)
	{
		result = "";
	}
	else
	{
		result = "chichi = vec4(0, 0, 1, 1);\n"
				 "    goku   = vec4(0, 0, 0, 1);\n"
				 "    goten  = vec4(0, 1, 0, 1);\n"
				 "    gohan  = vec4(1, 0, 0, 1);\n";
	}

	return result;
}